

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# advconsole.unix.cpp
# Opt level: O2

void AdvancedConsole::Cursor::getSize(int *rows,int *cols)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iTempCol;
  int *local_58;
  int *local_50;
  int iTempRow;
  int iOldCol;
  int iOldRow;
  
  local_58 = rows;
  local_50 = cols;
  getPosition(&iOldRow,&iOldCol);
  iVar1 = iOldRow;
  iVar2 = iOldCol;
  do {
    iVar4 = iVar2;
    iVar3 = iVar1;
    Cursor((Cursor *)&iTempRow,100,100,AC_RELATIVE);
    operator<<((ostream *)&std::cout,(Cursor *)&iTempRow);
    getPosition(&iTempRow,&iTempCol);
    iVar1 = iTempRow;
    iVar2 = iTempCol;
  } while (iTempCol != iVar4 || iTempRow != iVar3);
  Cursor((Cursor *)&iTempRow,iOldRow,iOldCol,AC_ABSOLUTE);
  operator<<((ostream *)&std::cout,(Cursor *)&iTempRow);
  *local_58 = iVar3;
  *local_50 = iVar4;
  return;
}

Assistant:

void AdvancedConsole::Cursor::getSize(int& rows, int& cols)
{
	int iOldRow, iOldCol;
	getPosition(iOldRow, iOldCol);
	
	int iTempLastRow = iOldRow, iTempLastCol = iOldCol;
	while (true)
	{
		cout << Cursor(100, 100, AC_RELATIVE);
		int iTempRow, iTempCol;
		getPosition(iTempRow, iTempCol);
		
		if (iTempRow != iTempLastRow || iTempCol != iTempLastCol)
		{
			iTempLastRow = iTempRow;
			iTempLastCol = iTempCol;
		}
		else
			break;
	}
	
	cout << Cursor(iOldRow, iOldCol, AC_ABSOLUTE);
	rows = iTempLastRow;
	cols = iTempLastCol;
}